

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::localDecl(Parser *this,TokenType tokenType)

{
  pointer pcVar1;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  Parser *this_00;
  ptr<Statement> pVar3;
  bool constant;
  Identifier identifier;
  ptr<Expression> expr;
  bool local_8a;
  undefined1 local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Alloc_hider local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [16];
  Klex *pKStack_38;
  unsigned_long local_30;
  _Alloc_hider _Stack_28;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,tokenType);
  local_8a = in_EDX == 0x2b;
  consume(this_00);
  local_58._0_4_ = (this_00->currentToken).type;
  pcVar1 = (this_00->currentToken).lexeme._M_dataplus._M_p;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this_00->currentToken).lexeme._M_string_length);
  local_30 = (this_00->currentToken).line;
  _Stack_28._M_p = (pointer)(this_00->currentToken).col;
  if (local_50._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8)) {
    local_88.field_2._8_8_ = pKStack_38;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)local_50._M_pi;
  }
  local_88.field_2._M_allocated_capacity = local_48._8_8_;
  local_88._M_string_length = local_48._0_8_;
  consume(this_00,Identifier,"identifier");
  consume(this_00,Assign,"assignment operator \'=\'");
  expression((Parser *)local_58);
  consume(this_00,StatEnd,"\';\'");
  local_68._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<LocalDeclarationStatement,std::allocator<LocalDeclarationStatement>,std::__cxx11::string&,bool&,std::shared_ptr<Expression>&>
            (&_Stack_60,(LocalDeclarationStatement **)&local_68,
             (allocator<LocalDeclarationStatement> *)&local_89,&local_88,&local_8a,
             (shared_ptr<Expression> *)local_58);
  (this->filepath)._M_dataplus._M_p = local_68._M_p;
  (this->filepath)._M_string_length = (size_type)_Stack_60._M_pi;
  _Var2._M_pi = extraout_RDX;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_01;
  }
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::localDecl(TokenType tokenType) {
    bool constant = tokenType == TokenType::Const;
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");
    consume(TokenType::Assign, "assignment operator '='");
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<LocalDeclarationStatement>(identifier, constant, expr);
}